

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O0

VRFloat __thiscall MinVR::VRDatum::getValueFloat(VRDatum *this)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000118;
  int *in_stack_00000120;
  string *in_stack_00000128;
  string *in_stack_00000130;
  string *in_stack_00000138;
  VRError *in_stack_00000140;
  char *in_stack_ffffffffffffff10;
  allocator<char> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  
  uVar1 = __cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff50);
  std::operator+(in_RDI,in_stack_ffffffffffffff10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  VRError::VRError(in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128,
                   in_stack_00000120,in_stack_00000118);
  __cxa_throw(uVar1,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

virtual VRFloat getValueFloat() const {
    VRERROR("This datum is not a VRFloat.", "It is a " + description + ".");
  }